

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::D3MFExporter::writeBaseMaterials(D3MFExporter *this)

{
  aiMaterial *pMat;
  aiReturn aVar1;
  ulong value;
  ostringstream *poVar2;
  aiColor4D color;
  string hexDiffuseColor;
  string tmp;
  string strName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  aiString name;
  
  poVar2 = &this->mModelOutput;
  std::operator<<((ostream *)poVar2,"<basematerials id=\"1\">\n");
  strName._M_dataplus._M_p = (pointer)&strName.field_2;
  strName._M_string_length = 0;
  hexDiffuseColor._M_dataplus._M_p = (pointer)&hexDiffuseColor.field_2;
  hexDiffuseColor._M_string_length = 0;
  strName.field_2._M_local_buf[0] = '\0';
  hexDiffuseColor.field_2._M_local_buf[0] = '\0';
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  for (value = 0; value < this->mScene->mNumMaterials; value = value + 1) {
    pMat = this->mScene->mMaterials[value];
    name.length = 0;
    name.data[0] = '\0';
    memset(name.data + 1,0x1b,0x3ff);
    aVar1 = aiGetMaterialString(pMat,"?mat.name",0,0,&name);
    if (aVar1 == aiReturn_SUCCESS) {
      std::__cxx11::string::assign((char *)&strName);
    }
    else {
      to_string<unsigned_long>(&local_4b8,value);
      std::operator+(&local_458,"basemat_",&local_4b8);
      std::__cxx11::string::operator=((string *)&strName,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_4b8);
    }
    color.r = 0.0;
    color.g = 0.0;
    color.b = 0.0;
    color.a = 0.0;
    aVar1 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,&color);
    if (aVar1 == aiReturn_SUCCESS) {
      hexDiffuseColor._M_string_length = 0;
      *hexDiffuseColor._M_dataplus._M_p = '\0';
      tmp._M_string_length = 0;
      *tmp._M_dataplus._M_p = '\0';
      std::__cxx11::string::assign((char *)&hexDiffuseColor);
      DecimalToHexa<float>(&local_458,color.r);
      std::__cxx11::string::operator=((string *)&tmp,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::append((string *)&hexDiffuseColor);
      DecimalToHexa<float>(&local_458,color.g);
      std::__cxx11::string::operator=((string *)&tmp,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::append((string *)&hexDiffuseColor);
      DecimalToHexa<float>(&local_458,color.b);
      std::__cxx11::string::operator=((string *)&tmp,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::append((string *)&hexDiffuseColor);
      DecimalToHexa<float>(&local_458,color.a);
      std::__cxx11::string::operator=((string *)&tmp,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::append((string *)&hexDiffuseColor);
    }
    else {
      std::__cxx11::string::assign((char *)&hexDiffuseColor);
    }
    std::operator+(&local_498,"<base name=\"",&strName);
    std::operator+(&local_478,&local_498,"\" ");
    std::operator+(&local_4d8,&local_478," displaycolor=\"");
    std::operator+(&local_4b8,&local_4d8,&hexDiffuseColor);
    std::operator+(&local_458,&local_4b8,"\" />\n");
    std::operator<<((ostream *)poVar2,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
  }
  std::operator<<((ostream *)poVar2,"</basematerials>\n");
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&hexDiffuseColor);
  std::__cxx11::string::~string((string *)&strName);
  return;
}

Assistant:

void D3MFExporter::writeBaseMaterials() {
    mModelOutput << "<basematerials id=\"1\">\n";
    std::string strName, hexDiffuseColor , tmp;
    for ( size_t i = 0; i < mScene->mNumMaterials; ++i ) {
        aiMaterial *mat = mScene->mMaterials[ i ];
        aiString name;
        if ( mat->Get( AI_MATKEY_NAME, name ) != aiReturn_SUCCESS ) {
            strName = "basemat_" + to_string( i );
        } else {
            strName = name.C_Str();
        }
        aiColor4D color;
        if ( mat->Get( AI_MATKEY_COLOR_DIFFUSE, color ) == aiReturn_SUCCESS ) {
            hexDiffuseColor.clear();
            tmp.clear();
            hexDiffuseColor = "#";
            
            tmp = DecimalToHexa( color.r );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.g );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.b );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.a );
            hexDiffuseColor += tmp;
        } else {
            hexDiffuseColor = "#FFFFFFFF";
        }

        mModelOutput << "<base name=\""+strName+"\" "+" displaycolor=\""+hexDiffuseColor+"\" />\n";
    }
    mModelOutput << "</basematerials>\n";
}